

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_16_2_357f297d
qclab::qgates::lambda_Phase<std::complex<float>>
          (Op op,complex<float> *lambda,complex<float> *vector)

{
  complex<float> *extraout_RDX;
  complex<float> cVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  anon_class_16_2_357f297d aVar2;
  anon_class_16_2_357f297d f;
  complex<float> *vector_local;
  complex<float> *lambda_local;
  Op op_local;
  
  cVar1._M_value = (_ComplexT)vector;
  if (op == ConjTrans) {
    std::conj<float>(lambda);
    lambda->_M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    cVar1._M_value = (_ComplexT)extraout_RDX;
  }
  aVar2.lambda._M_value = cVar1._M_value;
  aVar2.vector = vector;
  return aVar2;
}

Assistant:

auto lambda_Phase( Op op , T& lambda , T* vector ) {
    // operation
    if ( op == Op::ConjTrans ) lambda = std::conj( lambda ) ;
    // matvec
    auto f = [=] ( const uint64_t b ) {
      vector[b] *= lambda ;
    } ;
    return f ;
  }